

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day09.cpp
# Opt level: O0

void day09(input_t input)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  bool bVar6;
  uint uVar7;
  reference pvVar8;
  ulong uVar9;
  reference __b;
  long in_RSI;
  char *in_RDI;
  undefined1 auVar10 [64];
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar11;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar13;
  undefined8 extraout_YMM0_H;
  undefined8 uVar14;
  undefined8 extraout_var;
  undefined8 uVar15;
  undefined1 auVar12 [32];
  unsigned_long *s_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  uint64_t part2;
  uint32_t n_simulate2;
  uint32_t n_rounds2;
  unsigned_long *s;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  uint64_t part1;
  uint32_t n_rounds1;
  anon_class_64_8_da0cbc0f simulate;
  uint32_t turn;
  __m256i M;
  anon_class_8_1_a68a8be0 load_next;
  anon_class_8_1_8980366c append;
  vector<unsigned_long,_std::allocator<unsigned_long>_> score;
  size_t cur_player;
  int32_t *Mend;
  int32_t *Mnext;
  int32_t *marbles;
  __m256i new_marbles;
  array<int,_22UL> initial;
  uint8_t c;
  uint32_t n;
  uint32_t n_points;
  uint32_t n_players;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffc08;
  int *in_stack_fffffffffffffc10;
  allocator_type *in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc20 [32];
  uint *local_358;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_338;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_330;
  unsigned_long *local_328;
  uint local_320;
  uint local_31c;
  reference local_318;
  unsigned_long *local_310;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_308;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_300;
  size_t in_stack_fffffffffffffd08;
  unsigned_long count;
  undefined4 in_stack_fffffffffffffd10;
  int local_2a4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  size_type local_240;
  long local_238;
  int *local_230;
  void *local_228;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 local_200 [24];
  undefined1 local_1e8 [40];
  undefined1 auStack_1c0 [24];
  byte local_17d;
  uint local_17c;
  uint local_178;
  uint local_174;
  char *local_170;
  long local_168;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined8 local_100;
  undefined1 local_e0 [32];
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined1 local_a0 [32];
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  
  local_174 = 0;
  local_178 = 0;
  local_17c = 0;
  local_170 = in_RDI;
  local_168 = in_RSI;
  while (local_168 != 0) {
    local_17d = *local_170 - 0x30;
    if (local_17d < 10) {
      local_17c = local_17c * 10 + (uint)local_17d;
    }
    else if ((local_17c != 0) && (*local_170 == ' ')) {
      if (local_174 == 0) {
        local_358 = &local_174;
      }
      else {
        local_358 = &local_178;
      }
      *local_358 = local_17c;
      local_17c = 0;
    }
    local_170 = local_170 + 1;
    local_168 = local_168 + -1;
  }
  auVar3._40_24_ = _UNK_001514a0;
  auVar3._0_40_ = _DAT_00151478;
  auVar10 = vmovdqu64_avx512f(auVar3);
  auVar10 = vmovdqu64_avx512f(auVar10);
  auStack_1c0 = auVar10._40_24_;
  auVar10._24_40_ = _DAT_00151478;
  auVar10._0_24_ = _DAT_00151460;
  auVar10 = vmovdqu64_avx512f(auVar10);
  auVar10 = vmovdqa64_avx512f(auVar10);
  local_200 = auVar10._0_24_;
  local_1e8 = auVar10._24_40_;
  local_124 = 0x1c;
  local_128 = 0x18;
  local_12c = 0x1d;
  local_130 = 0x19;
  local_134 = 0x1e;
  local_138 = 0x1a;
  local_13c = 0x1f;
  local_140 = 0x1b;
  local_a4 = 0x1b;
  local_a8 = 0x1f;
  local_ac = 0x1a;
  local_b0 = 0x1e;
  local_b4 = 0x19;
  local_b8 = 0x1d;
  local_bc = 0x18;
  local_c0 = 0x1c;
  auVar1 = vpinsrd_avx(ZEXT416(0x1e),0x1a,1);
  auVar1 = vpinsrd_avx(auVar1,0x1f,2);
  auVar1 = vpinsrd_avx(auVar1,0x1b,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x1c),0x18,1);
  auVar2 = vpinsrd_avx(auVar2,0x1d,2);
  auVar2 = vpinsrd_avx(auVar2,0x19,3);
  local_e0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_e0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_168 = local_168 + -1;
  local_220 = local_e0._0_16_;
  auStack_210 = local_e0._16_16_;
  local_228 = (void *)aligned_alloc(0x20,local_178 * 0x180);
  uVar11 = extraout_XMM0_Qa;
  uVar13 = extraout_XMM0_Qb;
  uVar14 = extraout_YMM0_H;
  uVar15 = extraout_var;
  std::array<int,_22UL>::begin((array<int,_22UL> *)0x123489);
  std::array<int,_22UL>::end((array<int,_22UL> *)0x12349e);
  std::copy<int_const*,int*>
            ((int *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (int *)in_stack_fffffffffffffc08);
  local_230 = (int *)local_228;
  local_238 = (long)local_228 + 0x58;
  if (local_174 % 0x17 == 0) {
    local_174 = local_174 / 0x17;
  }
  local_240 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x123536);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffc20._8_8_,in_stack_fffffffffffffc20._0_8_,
             in_stack_fffffffffffffc18);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x123562);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&local_258,local_240);
  *pvVar8 = 0x20;
  day09::anon_class_8_1_a68a8be0::operator()((anon_class_8_1_a68a8be0 *)in_stack_fffffffffffffc18);
  local_144 = 0;
  local_148 = 4;
  local_14c = 1;
  local_150 = 5;
  local_154 = 2;
  local_158 = 6;
  local_15c = 3;
  local_160 = 7;
  local_54 = 7;
  local_58 = 3;
  local_5c = 6;
  local_60 = 2;
  local_64 = 5;
  local_68 = 1;
  local_6c = 4;
  local_70 = 0;
  auVar1 = vpinsrd_avx(ZEXT416(2),6,1);
  auVar1 = vpinsrd_avx(auVar1,3,2);
  auVar1 = vpinsrd_avx(auVar1,7,3);
  auVar2 = vpinsrd_avx(ZEXT416(0),4,1);
  auVar2 = vpinsrd_avx(auVar2,1,2);
  auVar2 = vpinsrd_avx(auVar2,5,3);
  auVar12._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_a0._16_8_ = auVar12._16_8_;
  local_a0._24_8_ = auVar12._24_8_;
  auVar5._8_8_ = uVar13;
  auVar5._0_8_ = uVar11;
  auVar5._16_8_ = uVar14;
  auVar5._24_8_ = uVar15;
  auVar4._16_8_ = local_a0._16_8_;
  auVar4._0_16_ = auVar12._0_16_;
  auVar4._24_8_ = local_a0._24_8_;
  vpermd_avx2(auVar4,auVar5);
  local_2a4 = 0x2e;
  uVar7 = local_178 / 0x17;
  local_100 = uVar11;
  local_a0 = auVar12;
  local_120 = auVar12._0_16_;
  auStack_110 = auVar12._16_16_;
  day09::anon_class_64_8_da0cbc0f::operator()
            ((anon_class_64_8_da0cbc0f *)CONCAT44(uVar7,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08);
  count = 0;
  local_300 = &local_258;
  local_308._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffc00);
  local_310 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        (in_stack_fffffffffffffc00);
  while( true ) {
    bVar6 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffc08,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffc00);
    if (!bVar6) break;
    local_318 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_308);
    in_stack_fffffffffffffc18 =
         (allocator_type *)
         std::max<unsigned_long>((unsigned_long *)&stack0xfffffffffffffd08,local_318);
    count = *(unsigned_long *)in_stack_fffffffffffffc18;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_308);
  }
  local_31c = (local_178 * 100) / 0x17;
  local_320 = (local_31c * 0x10 + 0x30) / 0x25;
  day09::anon_class_64_8_da0cbc0f::operator()
            ((anon_class_64_8_da0cbc0f *)CONCAT44(uVar7,in_stack_fffffffffffffd10),count);
  local_31c = local_31c - local_320;
  local_230 = (int *)((long)local_230 + 0x28);
  while (local_31c != 0) {
    local_240 = (long)(int)-(uint)(local_240 + 1 < (ulong)local_174) & local_240 + 1;
    uVar9 = (ulong)(uint)(local_2a4 + *local_230);
    local_31c = local_31c + -1;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_258,local_240);
    *pvVar8 = uVar9 + *pvVar8;
    local_230 = local_230 + 0x10;
    local_2a4 = local_2a4 + 0x17;
  }
  local_328 = (unsigned_long *)0x0;
  local_330 = &local_258;
  local_31c = local_31c + -1;
  local_338._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffc00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffc00);
  while( true ) {
    bVar6 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffc08,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffc00);
    if (!bVar6) break;
    __b = __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(&local_338);
    in_stack_fffffffffffffc08 =
         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          *)std::max<unsigned_long>((unsigned_long *)&local_328,__b);
    local_328 = in_stack_fffffffffffffc08->_M_current;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_338);
  }
  printf("Day 09 Part 1: %lu\nDay 09 Part 2: %lu\n",count,local_328);
  free(local_228);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc18);
  return;
}

Assistant:

void day09(input_t input) {
	uint32_t n_players = 0, n_points = 0;
	for (uint32_t n = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			n = 10 * n + c;
		} else if (n && *input.s == ' ') {
			(n_players ? n_points : n_players) = n;
			n = 0;
		}
	}

	// State after first round, from puzzle description
	constexpr std::array<int32_t, 22> initial = {
		 2, 20, 10, 21,  5, 22, 11,  1, 12,  6, 13,
		 3, 14,  7, 15,  0, 16,  8, 17,  4, 18, 19,
	};

	// Next marbles up for play, interleaved
	auto new_marbles = _mm256_setr_epi32(28, 24, 29, 25, 30, 26, 31, 27);

	// Initialize the playing field
	auto marbles = (int32_t *) aligned_alloc(32, n_points * 384);
	std::copy(initial.begin(), initial.end(), marbles);
	auto Mnext = marbles, Mend = marbles + 22;

	// Initialize score sheet
	if (n_players % 23 == 0) {
		n_players /= 23;
	}
	size_t cur_player = 0;
	std::vector<uint64_t> score(n_players);
	score[cur_player] = 32;

	const auto append = [&](size_t step, const __m256i& v) {
		_mm256_storeu_si256((__m256i *) Mend, v);
		Mend += step;
	};

	const auto load_next = [&]() {
		auto m = _mm256_load_si256((__m256i *) Mnext);
		Mnext += 8;
		return m;
	};

	// Prime the AVX2 register with the first group of 8 marbles
	auto M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 4, 1, 5, 2, 6, 3, 7));

	uint32_t turn = 46;

	auto simulate = [&](size_t count) {
		for (; count--; turn += 23) {
			// First 8 turns
			append(8, _mm256_blend_epi32(M, new_marbles, 0xaa));
			append(8, _mm256_shuffle_epi32(_mm256_blend_epi32(M, new_marbles, 0x55), 0xb1));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_set1_epi32(8));

			// Next 8 turns
			M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 4, 1, 5, 2, 6, 3, 7));
			append(8, _mm256_blend_epi32(M, new_marbles, 0xaa));
			append(8, _mm256_shuffle_epi32(_mm256_blend_epi32(M, new_marbles, 0x55), 0xb1));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_setr_epi32(0, 8, 6, 8, 4, 0, 5, 0));

			// Final 7 turns
			M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 3, 1, 5, 2, 4, 7, 6));
			append(5, _mm256_blend_epi32(M, new_marbles, 0xfa));

			cur_player++;
			cur_player &= -(cur_player < n_players);
			score[cur_player] += turn + _mm256_extract_epi32(M, 4);

			// Prepare the first 8 marbles of the next round
			M = _mm256_blend_epi32(_mm256_shuffle_epi32(M, 0x8d), new_marbles, 0x4c);
			M = _mm256_add_epi32(M, _mm256_setr_epi32(0, 0, 0, 4, 0, 0, 0, 0));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_setr_epi32(15, 7, 9, 7, 11, 15, 10, 15));
		}
	};

	// Part 1
	auto n_rounds1 = n_points / 23;
	simulate(n_rounds1 - 1);
	uint64_t part1 = 0;

	for (auto&& s : score) {
		part1 = std::max(part1, s);
	}

	// Part 2: 100x the number of points
	auto n_rounds2 = 100 * n_points / 23;

	// Simulate only enough to generate the scoreballs
	auto n_simulate2 = (n_rounds2 + 3) * 16 / 37;
	simulate(n_simulate2 - n_rounds1);
	n_rounds2 -= n_simulate2;

	// Tally up the remaining scoreballs
	for (Mnext += 10; n_rounds2--; Mnext += 16, turn += 23) {
		cur_player++;
		cur_player &= -(cur_player < n_players);
		score[cur_player] += turn + *Mnext;
	}

	uint64_t part2 = 0;
	for (auto&& s : score) {
		part2 = std::max(part2, s);
	}

	printf("Day 09 Part 1: %lu\nDay 09 Part 2: %lu\n", part1, part2);

	free(marbles);
}